

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCCurve.cpp
# Opt level: O1

IfcVector3 * __thiscall
Assimp::IFC::anon_unknown_9::Line::Eval(IfcVector3 *__return_storage_ptr__,Line *this,IfcFloat u)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  
  dVar1 = (this->v).y;
  dVar2 = (this->v).z;
  dVar3 = (this->p).y;
  dVar4 = (this->p).z;
  __return_storage_ptr__->x = (this->v).x * u + (this->p).x;
  __return_storage_ptr__->y = dVar1 * u + dVar3;
  __return_storage_ptr__->z = u * dVar2 + dVar4;
  return __return_storage_ptr__;
}

Assistant:

IfcVector3 Eval(IfcFloat u) const {
        return p + u*v;
    }